

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall obs::signal<void(int)>::operator()(signal<void(int)> *this,int *args)

{
  bool bVar1;
  iterator __begin0;
  iterator __end0;
  iterator iStack_68;
  iterator local_40;
  
  safe_list<obs::slot<void_(int)>_>::begin
            (&iStack_68,(safe_list<obs::slot<void_(int)>_> *)(this + 8));
  safe_list<obs::slot<void_(int)>_>::end(&local_40,(safe_list<obs::slot<void_(int)>_> *)(this + 8));
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int)>_>::iterator::operator!=(&iStack_68,&local_40);
    if (!bVar1) {
      safe_list<obs::slot<void_(int)>_>::iterator::~iterator(&local_40);
      safe_list<obs::slot<void_(int)>_>::iterator::~iterator(&iStack_68);
      return;
    }
    if ((iStack_68.m_node == (node *)0x0) || (iStack_68.m_locked == false)) break;
    if (iStack_68.m_value != (slot<void_(int)> *)0x0) {
      slot<void(int)>::operator()((slot<void(int)> *)iStack_68.m_value,args);
    }
    safe_list<obs::slot<void_(int)>_>::iterator::operator++(&iStack_68);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,
                "T *obs::safe_list<obs::slot<void (int)>>::iterator::operator*() const [T = obs::slot<void (int)>]"
               );
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }